

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void al_color_yuv_to_rgb(float y,float u,float v,float *red,float *green,float *blue)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 local_60;
  undefined8 local_48;
  undefined8 local_30;
  float *blue_local;
  float *green_local;
  float *red_local;
  float v_local;
  float u_local;
  float y_local;
  
  fVar1 = (u + u + -1.0) * 0.436;
  fVar2 = (v + v + -1.0) * 0.615;
  if (fVar2 * 1.13983 + y <= 1.0) {
    local_30 = (double)fVar2 * 1.13983 + (double)y;
  }
  else {
    local_30 = 1.0;
  }
  if (0.0 <= local_30) {
    if (fVar2 * 1.13983 + y <= 1.0) {
      fVar3 = fVar2 * 1.13983 + y;
    }
    else {
      fVar3 = 1.0;
    }
  }
  else {
    fVar3 = 0.0;
  }
  *red = fVar3;
  if (fVar2 * -0.5806 + fVar1 * -0.39465 + y <= 1.0) {
    local_48 = (double)fVar2 * -0.5806 + (double)fVar1 * -0.39465 + (double)y;
  }
  else {
    local_48 = 1.0;
  }
  if (0.0 <= local_48) {
    if (fVar2 * -0.5806 + fVar1 * -0.39465 + y <= 1.0) {
      fVar2 = fVar2 * -0.5806 + fVar1 * -0.39465 + y;
    }
    else {
      fVar2 = 1.0;
    }
  }
  else {
    fVar2 = 0.0;
  }
  *green = fVar2;
  if (fVar1 * 2.03211 + y <= 1.0) {
    local_60 = (double)fVar1 * 2.03211 + (double)y;
  }
  else {
    local_60 = 1.0;
  }
  if (0.0 <= local_60) {
    if (fVar1 * 2.03211 + y <= 1.0) {
      fVar1 = fVar1 * 2.03211 + y;
    }
    else {
      fVar1 = 1.0;
    }
  }
  else {
    fVar1 = 0.0;
  }
  *blue = fVar1;
  return;
}

Assistant:

void al_color_yuv_to_rgb(float y, float u, float v,
    float *red, float *green, float *blue)
{
   /* Translate range 0..1 to actual range. */
   u = 0.436 * (u * 2 - 1);
   v = 0.615 * (v * 2 - 1);
   *red = _ALLEGRO_CLAMP(0, 1, y + v * 1.13983);
   *green = _ALLEGRO_CLAMP(0, 1, y + u * -0.39465 + v * -0.58060);
   *blue = _ALLEGRO_CLAMP(0, 1, y + u * 2.03211);
}